

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionEntryPointInfo::Invalidate(FunctionEntryPointInfo *this,bool prolongEntryPoint)

{
  code *pcVar1;
  anon_class_16_2_0db8c0b9 func;
  bool bVar2;
  FunctionProxy *pFVar3;
  FunctionBody *this_00;
  FunctionEntryPointInfo *pFVar4;
  undefined4 *puVar5;
  ScriptContext *pSVar6;
  NativeCodeGenerator *nativeCodeGen;
  ThreadContext *this_01;
  ThreadContext *threadContext;
  AutoCleanup local_30;
  AutoCleanup autoCleanup;
  FunctionEntryPointInfo *entryPoint;
  FunctionBody *functionBody;
  bool prolongEntryPoint_local;
  FunctionEntryPointInfo *this_local;
  
  pFVar3 = Memory::WriteBarrierPtr<Js::FunctionProxy>::operator->(&this->functionProxy);
  bVar2 = FunctionProxy::IsDeferred(pFVar3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x2431,"(!this->functionProxy->IsDeferred())",
                                "!this->functionProxy->IsDeferred()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pFVar3 = Memory::WriteBarrierPtr<Js::FunctionProxy>::operator->(&this->functionProxy);
  this_00 = FunctionProxy::GetFunctionBody(pFVar3);
  pFVar4 = FunctionBody::GetSimpleJitEntryPointInfo(this_00);
  if (this == pFVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x2433,"(this != functionBody->GetSimpleJitEntryPointInfo())",
                                "this != functionBody->GetSimpleJitEntryPointInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  EntryPointInfo::FreeJitTransferData(&this->super_EntryPointInfo);
  autoCleanup.entryPointInfo =
       &FunctionBody::GetDefaultFunctionEntryPointInfo(this_00)->super_EntryPointInfo;
  bVar2 = EntryPointInfo::IsCodeGenPending(autoCleanup.entryPointInfo);
  if (bVar2) {
    Output::Trace(LazyBailoutPhase,L"Skipping creating new entrypoint as one is already pending\n");
  }
  else {
    Invalidate(bool)::AutoCleanup::AutoCleanup(Js::EntryPointInfo__
              (&local_30,&this->super_EntryPointInfo);
    autoCleanup.entryPointInfo =
         &FunctionBody::CreateNewDefaultEntryPoint(this_00)->super_EntryPointInfo;
    pSVar6 = FunctionProxy::GetScriptContext((FunctionProxy *)this_00);
    nativeCodeGen = ScriptContext::GetNativeCodeGenerator(pSVar6);
    GenerateFunction(nativeCodeGen,this_00,(ScriptFunction *)0x0);
    Invalidate::AutoCleanup::Done(&local_30);
    Invalidate::AutoCleanup::~AutoCleanup(&local_30);
  }
  pFVar3 = Memory::WriteBarrierPtr<Js::FunctionProxy>::operator->(&this->functionProxy);
  func.entryPoint = (FunctionEntryPointInfo **)&autoCleanup;
  func.this = this;
  FunctionProxy::MapFunctionObjectTypes<Js::FunctionEntryPointInfo::Invalidate(bool)::__0>
            (pFVar3,func);
  if (!prolongEntryPoint) {
    pFVar3 = Memory::WriteBarrierPtr<Js::FunctionProxy>::operator->(&this->functionProxy);
    pSVar6 = FunctionProxy::GetScriptContext(pFVar3);
    this_01 = ScriptContext::GetThreadContext(pSVar6);
    ThreadContext::QueueFreeOldEntryPointInfoIfInScript(this_01,this);
  }
  return;
}

Assistant:

void FunctionEntryPointInfo::Invalidate(bool prolongEntryPoint)
    {
        Assert(!this->functionProxy->IsDeferred());
        FunctionBody* functionBody = this->functionProxy->GetFunctionBody();
        Assert(this != functionBody->GetSimpleJitEntryPointInfo());

        // We may have got here following OOM in ProcessJitTransferData. Free any data we have
        // to reduce the chance of another OOM below.
        this->FreeJitTransferData();

        FunctionEntryPointInfo* entryPoint = functionBody->GetDefaultFunctionEntryPointInfo();
        if (entryPoint->IsCodeGenPending())
        {
            OUTPUT_TRACE(Js::LazyBailoutPhase, _u("Skipping creating new entrypoint as one is already pending\n"));
        }
        else
        {
            class AutoCleanup
            {
                EntryPointInfo *entryPointInfo;
            public:
                AutoCleanup(EntryPointInfo *entryPointInfo) : entryPointInfo(entryPointInfo)
                {
                }

                void Done()
                {
                    entryPointInfo = nullptr;
                }
                ~AutoCleanup()
                {
                    if (entryPointInfo)
                    {
                        entryPointInfo->ResetOnLazyBailoutFailure();
                    }
                }
            } autoCleanup(this);

            entryPoint = functionBody->CreateNewDefaultEntryPoint();

            GenerateFunction(functionBody->GetScriptContext()->GetNativeCodeGenerator(), functionBody, /*function*/ nullptr);
            autoCleanup.Done();

        }
        this->functionProxy->MapFunctionObjectTypes([&](ScriptFunctionType* functionType)
        {
            Assert(functionType->GetTypeId() == TypeIds_Function);

            if (functionType->GetEntryPointInfo() == this)
            {
                functionType->SetEntryPointInfo(entryPoint);
                functionType->SetEntryPoint(this->functionProxy->GetDirectEntryPoint(entryPoint));
            }
        });
        if (!prolongEntryPoint)
        {
            ThreadContext* threadContext = this->functionProxy->GetScriptContext()->GetThreadContext();
            threadContext->QueueFreeOldEntryPointInfoIfInScript(this);
        }
    }